

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeString(Reader *this,Token *token,string *decoded)

{
  Location extra;
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Location end;
  Location current;
  uint unicode;
  string local_68;
  Location local_48;
  Reader *local_40;
  uint local_34;
  
  local_40 = this;
  std::__cxx11::string::reserve((ulong)decoded);
  local_48 = token->start_ + 1;
  end = token->end_ + -1;
  do {
    if (local_48 == end) {
      return true;
    }
    extra = local_48 + 1;
    if (*local_48 == '\"') {
      iVar3 = 3;
      local_48 = extra;
    }
    else {
      if (*local_48 != '\\') goto LAB_0010ecad;
      if (extra == end) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_48 = extra;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Empty escape sequence in string","");
        addError(local_40,&local_68,token,extra);
LAB_0010ebba:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
LAB_0010ebcd:
        iVar3 = 1;
        goto LAB_0010ecb7;
      }
      extra = local_48 + 2;
      bVar2 = local_48[1];
      local_48 = extra;
      if (bVar2 < 0x62) {
        if (((bVar2 != 0x22) && (bVar2 != 0x2f)) && (bVar2 != 0x5c)) goto switchD_0010ebed_caseD_6f;
        goto LAB_0010ecad;
      }
      switch(bVar2) {
      case 0x6e:
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0010ebed_caseD_6f:
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Bad escape sequence in string","");
        addError(local_40,&local_68,token,extra);
        goto LAB_0010ebba;
      case 0x72:
        break;
      case 0x74:
        break;
      case 0x75:
        bVar1 = decodeUnicodeCodePoint(local_40,token,&local_48,end,&local_34);
        uVar4 = local_34;
        if (!bVar1) goto LAB_0010ebcd;
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_68._M_string_length = 0;
        local_68.field_2._M_local_buf[0] = '\0';
        if (local_34 < 0x80) {
          std::__cxx11::string::resize((ulong)&local_68,'\x01');
LAB_0010ed82:
          *local_68._M_dataplus._M_p = (char)uVar4;
        }
        else {
          bVar2 = (byte)local_34;
          if (local_34 < 0x800) {
            std::__cxx11::string::resize((ulong)&local_68,'\x02');
            local_68._M_dataplus._M_p[1] = bVar2 & 0x3f | 0x80;
            uVar4 = (uint)(byte)((byte)(uVar4 >> 6) | 0xc0);
            goto LAB_0010ed82;
          }
          if (local_34 < 0x10000) {
            std::__cxx11::string::resize((ulong)&local_68,'\x03');
            local_68._M_dataplus._M_p[2] = bVar2 & 0x3f | 0x80;
            local_68._M_dataplus._M_p[1] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
            uVar4 = (uint)(byte)((byte)(uVar4 >> 0xc) | 0xe0);
            goto LAB_0010ed82;
          }
          if (local_34 < 0x110000) {
            std::__cxx11::string::resize((ulong)&local_68,'\x04');
            local_68._M_dataplus._M_p[3] = bVar2 & 0x3f | 0x80;
            local_68._M_dataplus._M_p[2] = (byte)(uVar4 >> 6) & 0x3f | 0x80;
            local_68._M_dataplus._M_p[1] = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
            uVar4 = (uint)(byte)((byte)(uVar4 >> 0x12) | 0xf0);
            goto LAB_0010ed82;
          }
        }
        std::__cxx11::string::_M_append((char *)decoded,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        iVar3 = 1;
        if (!bVar1) goto LAB_0010ecb7;
        goto LAB_0010ecb5;
      default:
        if ((bVar2 != 0x66) && (bVar2 != 0x62)) goto switchD_0010ebed_caseD_6f;
      }
LAB_0010ecad:
      local_48 = extra;
      std::__cxx11::string::push_back((char)decoded);
LAB_0010ecb5:
      iVar3 = 0;
    }
LAB_0010ecb7:
    if (iVar3 != 0) {
      return iVar3 == 3;
    }
  } while( true );
}

Assistant:

bool Reader::decodeString(Token& token, std::string& decoded) {
  decoded.reserve(token.end_ - token.start_ - 2);
  Location current = token.start_ + 1; // skip '"'
  Location end = token.end_ - 1;       // do not include '"'
  while (current != end) {
    Char c = *current++;
    if (c == '"')
      break;
    else if (c == '\\') {
      if (current == end)
        return addError("Empty escape sequence in string", token, current);
      Char escape = *current++;
      switch (escape) {
      case '"':
        decoded += '"';
        break;
      case '/':
        decoded += '/';
        break;
      case '\\':
        decoded += '\\';
        break;
      case 'b':
        decoded += '\b';
        break;
      case 'f':
        decoded += '\f';
        break;
      case 'n':
        decoded += '\n';
        break;
      case 'r':
        decoded += '\r';
        break;
      case 't':
        decoded += '\t';
        break;
      case 'u': {
        unsigned int unicode;
        if (!decodeUnicodeCodePoint(token, current, end, unicode))
          return false;
        decoded += codePointToUTF8(unicode);
      } break;
      default:
        return addError("Bad escape sequence in string", token, current);
      }
    } else {
      decoded += c;
    }
  }
  return true;
}